

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O2

RC __thiscall RM_Manager::DestroyFile(RM_Manager *this,char *fileName)

{
  RC RVar1;
  
  if (fileName != (char *)0x0) {
    RVar1 = PF_Manager::DestroyFile(this->pfm,fileName);
    return RVar1;
  }
  return 0x6f;
}

Assistant:

RC RM_Manager::DestroyFile(const char *fileName) {
  if(fileName == NULL)
    return (RM_BADFILENAME);
  RC rc;
  if((rc = pfm.DestroyFile(fileName)))
    return (rc);
  return (0); 
}